

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O0

int find_skates(void)

{
  int iVar1;
  char *s;
  int i;
  
  s._0_4_ = 0x96;
  while( true ) {
    if (0x9c < (int)s) {
      impossible("snow boots not found?");
      return -1;
    }
    if ((obj_descr[objects[(int)s].oc_descr_idx].oc_descr != (char *)0x0) &&
       (iVar1 = strcmp(obj_descr[objects[(int)s].oc_descr_idx].oc_descr,"snow boots"), iVar1 == 0))
    break;
    s._0_4_ = (int)s + 1;
  }
  return (int)s;
}

Assistant:

int find_skates(void)
{
    int i;
    const char *s;

    for (i = SPEED_BOOTS; i <= LEVITATION_BOOTS; i++)
	if ((s = OBJ_DESCR(objects[i])) != 0 && !strcmp(s, "snow boots"))
	    return i;

    impossible("snow boots not found?");
    return -1;	/* not 0, or caller would try again each move */
}